

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

U32 ZSTD_insertAndFindFirstIndex(ZSTD_matchState_t *ms,BYTE *ip)

{
  uint uVar1;
  uint uVar2;
  U32 *pUVar3;
  BYTE *pBVar4;
  U32 *pUVar5;
  char cVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  
  lVar10 = -0x30e44323485a9b9d;
  uVar1 = (ms->cParams).minMatch;
  pUVar3 = ms->hashTable;
  uVar2 = (ms->cParams).hashLog;
  uVar7 = (ms->cParams).chainLog;
  pBVar4 = (ms->window).base;
  uVar11 = (ulong)ms->nextToUpdate;
  uVar9 = (uint)((long)ip - (long)pBVar4);
  cVar6 = (char)uVar2;
  if (ms->nextToUpdate < uVar9) {
    if (0x20 < uVar2) goto LAB_00188f11;
    pUVar5 = ms->chainTable;
    do {
      switch(uVar1) {
      case 5:
        uVar8 = *(long *)(pBVar4 + uVar11) * -0x30e4432345000000;
        break;
      case 6:
        uVar8 = *(long *)(pBVar4 + uVar11) * -0x30e4432340650000;
        break;
      case 7:
        uVar8 = *(long *)(pBVar4 + uVar11) * -0x30e44323405a9d00;
        break;
      case 8:
        uVar8 = *(long *)(pBVar4 + uVar11) * -0x30e44323485a9b9d;
        break;
      default:
        uVar8 = (ulong)((uint)(*(int *)(pBVar4 + uVar11) * -0x61c8864f) >> (0x20U - cVar6 & 0x1f));
        goto LAB_00188e6b;
      }
      uVar8 = uVar8 >> (0x40U - cVar6 & 0x3f);
LAB_00188e6b:
      pUVar5[(uint)uVar11 & ~(-1 << ((byte)uVar7 & 0x1f))] = pUVar3[uVar8];
      pUVar3[uVar8] = (uint)uVar11;
      uVar11 = uVar11 + 1;
    } while (uVar11 < ((long)ip - (long)pBVar4 & 0xffffffffU));
  }
  ms->nextToUpdate = uVar9;
  if (0x20 < uVar2) {
LAB_00188f11:
    __assert_fail("hBits <= 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
  }
  switch(uVar1) {
  case 5:
    lVar10 = -0x30e4432345000000;
    break;
  case 6:
    lVar10 = -0x30e4432340650000;
    break;
  case 7:
    lVar10 = -0x30e44323405a9d00;
    break;
  case 8:
    break;
  default:
    uVar11 = (ulong)((uint)(*(int *)ip * -0x61c8864f) >> (-cVar6 & 0x1fU));
    goto LAB_00188eec;
  }
  uVar11 = (ulong)(lVar10 * *(long *)ip) >> (-cVar6 & 0x3fU);
LAB_00188eec:
  return pUVar3[uVar11];
}

Assistant:

U32 ZSTD_insertAndFindFirstIndex(ZSTD_matchState_t* ms, const BYTE* ip) {
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    return ZSTD_insertAndFindFirstIndex_internal(ms, cParams, ip, ms->cParams.minMatch, /* lazySkipping*/ 0);
}